

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ERK.cpp
# Opt level: O3

void __thiscall RK4::Step(RK4 *this,double t,Mat *y,double h,Mat *u)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Derivs2 p_Var3;
  Mat *right;
  double *in_RCX;
  Mat MVar4;
  Mat MVar5;
  Mat MVar6;
  Mat MVar7;
  Mat MVar8;
  Mat MVar9;
  Mat MVar10;
  Mat MVar11;
  Mat MStack_198;
  Mat local_188;
  double local_178;
  double local_170;
  Mat *local_168;
  double local_160;
  Mat *local_158;
  Mat local_150;
  Mat local_140;
  Mat local_130;
  Mat local_120;
  Mat local_110;
  Mat local_100;
  Mat local_f0;
  Mat local_e0;
  Mat local_d0;
  Mat local_c0;
  Mat local_b0;
  Mat local_a0;
  Mat local_90;
  Mat local_80;
  Mat local_70;
  Mat local_60;
  Mat local_50;
  Mat local_40;
  
  p_Var3 = this->f_;
  local_178 = t;
  local_170 = h;
  Mat::Mat(&local_a0,y);
  Mat::Mat(&local_b0,u);
  MVar4.v_ = (double *)&local_a0;
  MVar4._0_8_ = &MStack_198;
  MVar8.v_ = in_RCX;
  MVar8._0_8_ = &local_b0;
  (*p_Var3)(local_178,MVar4,MVar8);
  local_168 = y;
  Mat::operator=(&local_40,&this->k_1_);
  local_160 = local_170 * 0.5;
  Mat::~Mat(&local_40);
  Mat::~Mat(&MStack_198);
  Mat::~Mat(&local_b0);
  Mat::~Mat(&local_a0);
  p_Var3 = this->f_;
  operator*(&local_188,local_160);
  operator+(&local_c0,local_168);
  Mat::Mat(&local_d0,u);
  MVar5.v_ = (double *)&local_c0;
  MVar5._0_8_ = &MStack_198;
  MVar9.v_ = in_RCX;
  MVar9._0_8_ = &local_d0;
  (*p_Var3)(local_160 + local_178,MVar5,MVar9);
  local_158 = &this->k_1_;
  Mat::operator=(&local_50,&this->k_2_);
  Mat::~Mat(&local_50);
  Mat::~Mat(&MStack_198);
  Mat::~Mat(&local_d0);
  Mat::~Mat(&local_c0);
  Mat::~Mat(&local_188);
  p_Var3 = this->f_;
  operator*(&local_188,local_160);
  operator+(&local_e0,local_168);
  Mat::Mat(&local_f0,u);
  local_178 = local_178 + local_170;
  MVar6.v_ = (double *)&local_e0;
  MVar6._0_8_ = &MStack_198;
  MVar10.v_ = in_RCX;
  MVar10._0_8_ = &local_f0;
  (*p_Var3)(local_178,MVar6,MVar10);
  Mat::operator=(&local_60,&this->k_3_);
  Mat::~Mat(&local_60);
  Mat::~Mat(&MStack_198);
  Mat::~Mat(&local_f0);
  Mat::~Mat(&local_e0);
  Mat::~Mat(&local_188);
  p_Var3 = this->f_;
  operator*(&local_188,local_170);
  operator+(&local_100,local_168);
  Mat::Mat(&local_110,u);
  MVar7.v_ = (double *)&local_100;
  MVar7._0_8_ = &MStack_198;
  MVar11.v_ = in_RCX;
  MVar11._0_8_ = &local_110;
  (*p_Var3)(local_178,MVar7,MVar11);
  Mat::operator=(&local_70,&this->k_4_);
  Mat::~Mat(&local_70);
  Mat::~Mat(&MStack_198);
  Mat::~Mat(&local_110);
  Mat::~Mat(&local_100);
  Mat::~Mat(&local_188);
  operator*(&local_90,2.0);
  operator+(&local_140,local_158);
  operator*(&local_150,2.0);
  right = local_168;
  operator+(&local_130,&local_140);
  operator+(&local_120,&local_130);
  operator*(local_170 / 6.0,&local_188);
  operator+(&MStack_198,right);
  Mat::operator=(&local_80,right);
  Mat::~Mat(&local_80);
  Mat::~Mat(&MStack_198);
  Mat::~Mat(&local_188);
  Mat::~Mat(&local_120);
  Mat::~Mat(&local_130);
  Mat::~Mat(&local_150);
  Mat::~Mat(&local_140);
  Mat::~Mat(&local_90);
  uVar1 = this->n_fevals_;
  uVar2 = this->n_steps_;
  this->n_fevals_ = uVar1 + 4;
  this->n_steps_ = uVar2 + 1;
  return;
}

Assistant:

void RK4::Step(double t, Mat& y, double h, Mat u) {		
	// Elementary RK4 step
	double hh = h*0.5;
	double h6 = h/6.0;
	double th = t+hh;
	k_1_ = f_(t, y, u);
	k_2_ = f_(t+hh, y+k_1_*hh, u);
	k_3_ = f_(t+h, y+k_2_*hh, u);  
	k_4_ = f_(t+h, y+k_3_*h, u);
	y = y + h6*(k_1_ + k_2_*2.0 + k_3_*2.0 + k_4_);
	n_fevals_ += 4;
	n_steps_ += 1;  
	t = t + h; // Update independent variable
}